

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemorySize
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name memory)

{
  __node_base_ptr p_Var1;
  Address AVar2;
  Load *curr;
  Literal *extraout_RDX;
  ModuleRunnerBase<wasm::ModuleRunner> *this_00;
  Literal LStack_68;
  ModuleRunnerBase<wasm::ModuleRunner> *pMStack_50;
  undefined1 local_20 [8];
  Name memory_local;
  
  AVar2.addr = memory.super_IString.str._M_str;
  local_20 = memory.super_IString.str._M_len;
  curr = (Load *)(AVar2.addr % (this->memorySizes)._M_h._M_bucket_count);
  memory_local.super_IString.str._M_len = AVar2.addr;
  p_Var1 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->memorySizes)._M_h,(size_type)curr,(key_type *)local_20,AVar2.addr);
  if ((p_Var1 != (__node_base_ptr)0x0) && (p_Var1->_M_nxt != (_Hash_node_base *)0x0)) {
    return (Address)(address64_t)p_Var1->_M_nxt[3]._M_nxt;
  }
  this_00 = this;
  getMemorySize(this);
  pMStack_50 = this;
  wasm::Literal::Literal(&LStack_68,extraout_RDX);
  AVar2 = getFinalAddress<wasm::Load>(this_00,curr,&LStack_68,(uint)curr->bytes,AVar2);
  wasm::Literal::~Literal(&LStack_68);
  return (Address)AVar2.addr;
}

Assistant:

Address getMemorySize(Name memory) {
    auto iter = memorySizes.find(memory);
    if (iter == memorySizes.end()) {
      externalInterface->trap("getMemorySize called on non-existing memory");
    }
    return iter->second;
  }